

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_user_geometry.h
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::UserGeometryISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,UserGeometryISA *this,PrimRef *prims,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined1 auVar1 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined4 uVar3;
  size_t sVar4;
  float fVar5;
  unsigned_long uVar6;
  size_t sVar7;
  float fVar8;
  float fVar10;
  float fVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  BBox3fa b;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  void *local_80;
  float local_78;
  undefined4 local_74;
  undefined1 *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [40];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar6 = r->_begin;
  local_68 = ZEXT416(geomID);
  sVar4 = 0;
  local_98._8_8_ = 0xff800000ff800000;
  local_98._0_8_ = 0xff800000ff800000;
  local_b8._8_8_ = 0xff800000ff800000;
  local_b8._0_8_ = 0xff800000ff800000;
  local_a8._8_4_ = 0x7f800000;
  local_a8._0_8_ = 0x7f8000007f800000;
  local_a8._12_4_ = 0x7f800000;
  local_c8._8_4_ = 0x7f800000;
  local_c8._0_8_ = 0x7f8000007f800000;
  local_c8._12_4_ = 0x7f800000;
  for (; uVar6 < r->_end; uVar6 = uVar6 + 1) {
    local_80 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
    fVar5 = (float)uVar6;
    local_74 = 0;
    local_70 = local_58;
    local_78 = fVar5;
    uVar3 = (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                      (&local_80);
    fVar8 = local_58._0_4_;
    fVar10 = local_58._4_4_;
    fVar11 = local_58._8_4_;
    fVar12 = local_58._16_4_;
    fVar13 = local_58._20_4_;
    fVar14 = local_58._24_4_;
    auVar15._0_4_ = -(uint)(fVar8 <= fVar12 && (-1.844e+18 < fVar8 && fVar12 < 1.844e+18));
    auVar15._4_4_ = -(uint)(fVar10 <= fVar13 && (-1.844e+18 < fVar10 && fVar13 < 1.844e+18));
    auVar15._8_4_ = -(uint)(fVar11 <= fVar14 && (-1.844e+18 < fVar11 && fVar14 < 1.844e+18));
    auVar15._12_4_ =
         -(uint)(local_58._12_4_ <= local_58._28_4_ &&
                (-1.844e+18 < local_58._12_4_ && local_58._28_4_ < 1.844e+18));
    uVar3 = movmskps(uVar3,auVar15);
    sVar7 = k;
    if ((~(byte)uVar3 & 7) == 0) {
      aVar9._0_12_ = local_58._0_12_;
      aVar9.m128[3] = local_68._0_4_;
      local_c8 = minps(local_c8,(undefined1  [16])aVar9);
      auVar1._12_4_ = fVar5;
      auVar1._0_12_ = local_58._16_12_;
      local_b8 = maxps(local_b8,auVar1);
      auVar16._0_4_ = fVar8 + fVar12;
      auVar16._4_4_ = fVar10 + fVar13;
      auVar16._8_4_ = fVar11 + fVar14;
      auVar16._12_4_ = local_68._0_4_ + fVar5;
      local_a8 = minps(local_a8,auVar16);
      local_98 = maxps(local_98,auVar16);
      sVar4 = sVar4 + 1;
      sVar7 = k + 1;
      prims[k].lower.field_0 = aVar9;
      aVar2.m128[3] = fVar5;
      aVar2._0_12_ = local_58._16_12_;
      prims[k].upper.field_0 = aVar2;
    }
    k = sVar7;
  }
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = local_c8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = local_c8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = local_b8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = local_b8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_a8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = local_a8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_98._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = local_98._8_8_;
  __return_storage_ptr__->end = sVar4;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,&bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }